

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_134::
     genericCheckTestMessageAllZero<capnproto_test::capnp::test::TestAllTypes::Builder>
               (Builder reader)

{
  bool bVar1;
  float fVar2;
  double dVar3;
  Builder local_1948;
  uint local_191c;
  uint local_1918;
  bool local_1911;
  undefined1 local_1910 [7];
  bool _kj_shouldLog_59;
  uint local_18e4;
  uint local_18e0;
  DebugExpression<unsigned_int> local_18dc;
  undefined1 local_18d8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_59;
  uint local_188c;
  uint local_1888;
  bool local_1881;
  undefined1 local_1880 [7];
  bool _kj_shouldLog_58;
  uint local_1854;
  uint local_1850;
  DebugExpression<unsigned_int> local_184c;
  undefined1 local_1848 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_58;
  uint local_17fc;
  uint local_17f8;
  bool local_17f1;
  undefined1 local_17f0 [7];
  bool _kj_shouldLog_57;
  uint local_17c4;
  uint local_17c0;
  DebugExpression<unsigned_int> local_17bc;
  undefined1 local_17b8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_57;
  uint local_176c;
  uint local_1768;
  bool local_1761;
  undefined1 local_1760 [7];
  bool _kj_shouldLog_56;
  uint local_1734;
  uint local_1730;
  DebugExpression<unsigned_int> local_172c;
  undefined1 local_1728 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_56;
  uint local_16dc;
  uint local_16d8;
  bool local_16d1;
  undefined1 local_16d0 [7];
  bool _kj_shouldLog_55;
  uint local_16a4;
  uint local_16a0;
  DebugExpression<unsigned_int> local_169c;
  undefined1 local_1698 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_55;
  uint local_164c;
  uint local_1648;
  bool local_1641;
  undefined1 local_1640 [7];
  bool _kj_shouldLog_54;
  uint local_1614;
  uint local_1610;
  DebugExpression<unsigned_int> local_160c;
  undefined1 local_1608 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_54;
  uint local_15bc;
  uint local_15b8;
  bool local_15b1;
  undefined1 local_15b0 [7];
  bool _kj_shouldLog_53;
  uint local_1584;
  uint local_1580;
  DebugExpression<unsigned_int> local_157c;
  undefined1 local_1578 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_53;
  uint local_152c;
  uint local_1528;
  bool local_1521;
  undefined1 local_1520 [7];
  bool _kj_shouldLog_52;
  uint local_14f4;
  uint local_14f0;
  DebugExpression<unsigned_int> local_14ec;
  undefined1 local_14e8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_52;
  uint local_149c;
  uint local_1498;
  bool local_1491;
  undefined1 local_1490 [7];
  bool _kj_shouldLog_51;
  uint local_1464;
  uint local_1460;
  DebugExpression<unsigned_int> local_145c;
  undefined1 local_1458 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_51;
  uint local_140c;
  uint local_1408;
  bool local_1401;
  undefined1 local_1400 [7];
  bool _kj_shouldLog_50;
  uint local_13d4;
  uint local_13d0;
  DebugExpression<unsigned_int> local_13cc;
  undefined1 local_13c8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_50;
  uint local_137c;
  uint local_1378;
  bool local_1371;
  undefined1 local_1370 [7];
  bool _kj_shouldLog_49;
  uint local_1344;
  uint local_1340;
  DebugExpression<unsigned_int> local_133c;
  undefined1 local_1338 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_49;
  uint local_12ec;
  uint local_12e8;
  bool local_12e1;
  undefined1 local_12e0 [7];
  bool _kj_shouldLog_48;
  uint local_12b4;
  uint local_12b0;
  DebugExpression<unsigned_int> local_12ac;
  undefined1 local_12a8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_48;
  uint local_125c;
  uint local_1258;
  bool local_1251;
  undefined1 local_1250 [7];
  bool _kj_shouldLog_47;
  uint local_1224;
  uint local_1220;
  DebugExpression<unsigned_int> local_121c;
  undefined1 local_1218 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_47;
  uint local_11cc;
  uint local_11c8;
  bool local_11c1;
  undefined1 local_11c0 [7];
  bool _kj_shouldLog_46;
  uint local_1194;
  uint local_1190;
  DebugExpression<unsigned_int> local_118c;
  undefined1 local_1188 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_46;
  uint local_113c;
  uint local_1138;
  bool local_1131;
  undefined1 local_1130 [7];
  bool _kj_shouldLog_45;
  uint local_1104;
  uint local_1100;
  DebugExpression<unsigned_int> local_10fc;
  undefined1 local_10f8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_45;
  uint local_10ac;
  uint local_10a8;
  bool local_10a1;
  undefined1 local_10a0 [7];
  bool _kj_shouldLog_44;
  uint local_1074;
  uint local_1070;
  DebugExpression<unsigned_int> local_106c;
  undefined1 local_1068 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_44;
  uint local_101c;
  uint local_1018;
  bool local_1011;
  undefined1 local_1010 [7];
  bool _kj_shouldLog_43;
  uint local_fe4;
  uint local_fe0;
  DebugExpression<unsigned_int> local_fdc;
  undefined1 local_fd8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_43;
  uint local_f8c;
  uint local_f88;
  bool local_f81;
  undefined1 local_f80 [7];
  bool _kj_shouldLog_42;
  uint local_f54;
  uint local_f50;
  DebugExpression<unsigned_int> local_f4c;
  undefined1 local_f48 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_42;
  uint local_efc;
  uint local_ef8;
  bool local_ef1;
  undefined1 local_ef0 [7];
  bool _kj_shouldLog_41;
  uint local_ec4;
  uint local_ec0;
  DebugExpression<unsigned_int> local_ebc;
  undefined1 local_eb8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_41;
  uint local_e6c;
  uint local_e68;
  bool local_e61;
  undefined1 local_e60 [7];
  bool _kj_shouldLog_40;
  uint local_e34;
  uint local_e30;
  DebugExpression<unsigned_int> local_e2c;
  undefined1 local_e28 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_40;
  uint local_ddc;
  uint local_dd8;
  bool local_dd1;
  undefined1 local_dd0 [7];
  bool _kj_shouldLog_39;
  uint local_da4;
  uint local_da0;
  DebugExpression<unsigned_int> local_d9c;
  undefined1 local_d98 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_39;
  uint local_d4c;
  uint local_d48;
  bool local_d41;
  undefined1 local_d40 [7];
  bool _kj_shouldLog_38;
  uint local_d14;
  uint local_d10;
  DebugExpression<unsigned_int> local_d0c;
  undefined1 local_d08 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_38;
  uint local_cbc;
  uint local_cb8;
  bool local_cb1;
  undefined1 local_cb0 [7];
  bool _kj_shouldLog_37;
  uint local_c84;
  uint local_c80;
  DebugExpression<unsigned_int> local_c7c;
  undefined1 local_c78 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_37;
  uint local_c2c;
  uint local_c28;
  bool local_c21;
  undefined1 local_c20 [7];
  bool _kj_shouldLog_36;
  uint local_bf4;
  uint local_bf0;
  DebugExpression<unsigned_int> local_bec;
  undefined1 local_be8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_36;
  uint local_b9c;
  uint local_b98;
  bool local_b91;
  undefined1 local_b90 [7];
  bool _kj_shouldLog_35;
  uint local_b64;
  uint local_b60;
  DebugExpression<unsigned_int> local_b5c;
  undefined1 local_b58 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_35;
  uint local_b0c;
  uint local_b08;
  bool local_b01;
  undefined1 local_b00 [7];
  bool _kj_shouldLog_34;
  uint local_ad4;
  uint local_ad0;
  DebugExpression<unsigned_int> local_acc;
  undefined1 local_ac8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_34;
  uint local_a7c;
  uint local_a78;
  bool local_a71;
  undefined1 local_a70 [7];
  bool _kj_shouldLog_33;
  uint local_a44;
  uint local_a40;
  DebugExpression<unsigned_int> local_a3c;
  undefined1 local_a38 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_33;
  uint local_9ec;
  uint local_9e8;
  bool local_9e1;
  undefined1 local_9e0 [7];
  bool _kj_shouldLog_32;
  uint local_9b4;
  uint local_9b0;
  DebugExpression<unsigned_int> local_9ac;
  undefined1 local_9a8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_32;
  uint local_95c;
  uint local_958;
  bool local_951;
  undefined1 local_950 [7];
  bool _kj_shouldLog_31;
  uint local_924;
  uint local_920;
  DebugExpression<unsigned_int> local_91c;
  undefined1 local_918 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_31;
  uint local_8cc;
  uint local_8c8;
  bool local_8c1;
  undefined1 local_8c0 [7];
  bool _kj_shouldLog_30;
  uint local_894;
  uint local_890;
  DebugExpression<unsigned_int> local_88c;
  undefined1 local_888 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_30;
  Builder local_840;
  bool local_821;
  undefined1 local_820 [7];
  bool _kj_shouldLog_29;
  Builder local_7f8;
  char (*local_7e0) [1];
  undefined1 local_7d8 [8];
  DebugComparison<const_char_(&)[1],_capnp::Text::Builder> _kjCondition_29;
  bool local_781;
  undefined1 local_780 [7];
  bool _kj_shouldLog_28;
  char (*local_768) [1];
  undefined1 local_760 [8];
  DebugComparison<const_char_(&)[1],_capnp::Text::Builder> _kjCondition_28;
  Builder subSubReader;
  ArrayPtr<const_unsigned_char> local_6f0;
  bool local_6d9;
  undefined1 auStack_6d8 [7];
  bool _kj_shouldLog_27;
  ArrayPtr<const_unsigned_char> local_6c8;
  ArrayPtr<const_unsigned_char> local_6b8;
  undefined1 local_6a8 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> _kjCondition_27;
  bool local_651;
  undefined1 local_650 [7];
  bool _kj_shouldLog_26;
  char (*local_638) [1];
  undefined1 local_630 [8];
  DebugComparison<const_char_(&)[1],_capnp::Text::Builder> _kjCondition_26;
  double local_5f0;
  bool local_5e7;
  bool local_5e6;
  DebugExpression<bool> local_5e5;
  int local_5e4;
  bool _kj_shouldLog_25;
  float fStack_5e0;
  DebugExpression<bool> _kjCondition_25;
  bool local_5db;
  bool local_5da;
  DebugExpression<bool> local_5d9;
  bool _kj_shouldLog_24;
  uint64_t uStack_5d8;
  DebugExpression<bool> _kjCondition_24;
  uint local_5d0;
  bool local_5c9;
  uint64_t uStack_5c8;
  bool _kj_shouldLog_23;
  uint local_5c0;
  DebugExpression<unsigned_int> local_5bc;
  undefined1 local_5b8 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition_23;
  bool local_585;
  uint32_t local_584;
  uint uStack_580;
  bool _kj_shouldLog_22;
  DebugExpression<unsigned_int> local_57c;
  undefined1 local_578 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_22;
  uint local_550;
  bool local_54b;
  uint16_t local_54a;
  uint local_548;
  bool _kj_shouldLog_21;
  DebugExpression<unsigned_int> DStack_544;
  undefined1 local_540 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_21;
  uint local_518;
  bool local_512;
  uint8_t local_511;
  uint local_510;
  bool _kj_shouldLog_20;
  DebugExpression<unsigned_int> DStack_50c;
  undefined1 local_508 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_20;
  int local_4e0;
  bool local_4d9;
  int64_t iStack_4d8;
  bool _kj_shouldLog_19;
  int local_4d0;
  DebugExpression<int> local_4cc;
  undefined1 local_4c8 [8];
  DebugComparison<int,_long> _kjCondition_19;
  bool local_495;
  int32_t local_494;
  int iStack_490;
  bool _kj_shouldLog_18;
  DebugExpression<int> local_48c;
  undefined1 local_488 [8];
  DebugComparison<int,_int> _kjCondition_18;
  int local_460;
  bool local_45b;
  int16_t local_45a;
  int local_458;
  bool _kj_shouldLog_17;
  DebugExpression<int> DStack_454;
  undefined1 local_450 [8];
  DebugComparison<int,_short> _kjCondition_17;
  int local_428;
  bool local_422;
  int8_t local_421;
  int local_420;
  bool _kj_shouldLog_16;
  DebugExpression<int> DStack_41c;
  undefined1 local_418 [8];
  DebugComparison<int,_signed_char> _kjCondition_16;
  undefined1 local_3f0 [4];
  bool _kj_shouldLog_15;
  DebugComparison<bool,_bool> _kjCondition_15;
  bool _kj_shouldLog_14;
  DebugExpression<const_capnp::Void_&> DStack_3c8;
  undefined1 local_3c0 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition_14;
  Builder subReader;
  ArrayPtr<const_unsigned_char> local_360;
  bool local_349;
  undefined1 auStack_348 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_unsigned_char> local_338;
  ArrayPtr<const_unsigned_char> local_328;
  undefined1 local_318 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> _kjCondition_13;
  bool local_2c1;
  undefined1 local_2c0 [7];
  bool _kj_shouldLog_12;
  char (*local_2a8) [1];
  undefined1 local_2a0 [8];
  DebugComparison<const_char_(&)[1],_capnp::Text::Builder> _kjCondition_12;
  double local_260;
  bool local_257;
  bool local_256;
  DebugExpression<bool> local_255;
  int local_254;
  bool _kj_shouldLog_11;
  float fStack_250;
  DebugExpression<bool> _kjCondition_11;
  bool local_24b;
  bool local_24a;
  DebugExpression<bool> local_249;
  bool _kj_shouldLog_10;
  uint64_t uStack_248;
  DebugExpression<bool> _kjCondition_10;
  uint local_240;
  bool local_239;
  uint64_t uStack_238;
  bool _kj_shouldLog_9;
  uint local_230;
  DebugExpression<unsigned_int> local_22c;
  undefined1 local_228 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition_9;
  bool local_1f5;
  uint32_t local_1f4;
  uint uStack_1f0;
  bool _kj_shouldLog_8;
  DebugExpression<unsigned_int> local_1ec;
  undefined1 local_1e8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  uint local_1c0;
  bool local_1bb;
  uint16_t local_1ba;
  uint local_1b8;
  bool _kj_shouldLog_7;
  DebugExpression<unsigned_int> DStack_1b4;
  undefined1 local_1b0 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_7;
  uint local_188;
  bool local_182;
  uint8_t local_181;
  uint local_180;
  bool _kj_shouldLog_6;
  DebugExpression<unsigned_int> DStack_17c;
  undefined1 local_178 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_6;
  int local_150;
  bool local_149;
  int64_t iStack_148;
  bool _kj_shouldLog_5;
  int local_140;
  DebugExpression<int> local_13c;
  undefined1 local_138 [8];
  DebugComparison<int,_long> _kjCondition_5;
  bool local_105;
  int32_t local_104;
  int iStack_100;
  bool _kj_shouldLog_4;
  DebugExpression<int> local_fc;
  undefined1 local_f8 [8];
  DebugComparison<int,_int> _kjCondition_4;
  int local_d0;
  bool local_cb;
  int16_t local_ca;
  int local_c8;
  bool _kj_shouldLog_3;
  DebugExpression<int> DStack_c4;
  undefined1 local_c0 [8];
  DebugComparison<int,_short> _kjCondition_3;
  int local_98;
  bool local_92;
  int8_t local_91;
  int local_90;
  bool _kj_shouldLog_2;
  DebugExpression<int> DStack_8c;
  undefined1 local_88 [8];
  DebugComparison<int,_signed_char> _kjCondition_2;
  undefined1 local_60 [4];
  bool _kj_shouldLog_1;
  DebugComparison<bool,_bool> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<const_capnp::Void_&> DStack_38;
  undefined1 local_30 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition;
  
  DStack_38 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField((Builder *)&stack0x00000008);
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_30,
             (DebugExpression<capnp::Void_const&> *)&stack0xffffffffffffffc8,
             (Void *)&_kjCondition_1.field_0x1f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    _kjCondition_1._29_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._29_1_ != '\0') {
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c4,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.getVoidField())\", _kjCondition, VOID, reader.getVoidField()"
                 ,(char (*) [51])"failed: expected (VOID) == (reader.getVoidField())",
                 (DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_30,(Void *)&VOID,
                 (Void *)&_kjCondition_1.field_0x1c);
      _kjCondition_1._29_1_ = 0;
    }
  }
  _kjCondition_2._30_1_ = 0;
  _kjCondition_2._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_2.field_0x1e);
  _kjCondition_2._29_1_ =
       capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField((Builder *)&stack0x00000008)
  ;
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_60,
             (DebugExpression<bool> *)&_kjCondition_2.field_0x1f,(bool *)&_kjCondition_2.field_0x1d)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar1) {
    _kjCondition_2._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._28_1_ != '\0') {
      _kjCondition_2._27_1_ = 0;
      _kjCondition_2._26_1_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c5,ERROR,
                 "\"failed: expected \" \"(false) == (reader.getBoolField())\", _kjCondition, false, reader.getBoolField()"
                 ,(char (*) [52])"failed: expected (false) == (reader.getBoolField())",
                 (DebugComparison<bool,_bool> *)local_60,(bool *)&_kjCondition_2.field_0x1b,
                 (bool *)&_kjCondition_2.field_0x1a);
      _kjCondition_2._28_1_ = 0;
    }
  }
  local_90 = 0;
  DStack_8c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_90);
  local_91 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field
                       ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_88,&stack0xffffffffffffff74,&local_91);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
  if (!bVar1) {
    local_92 = kj::_::Debug::shouldLog(ERROR);
    while (local_92 != false) {
      local_98 = 0;
      _kjCondition_3._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c6,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt8Field())\", _kjCondition, 0, reader.getInt8Field()"
                 ,(char (*) [48])"failed: expected (0) == (reader.getInt8Field())",
                 (DebugComparison<int,_signed_char> *)local_88,&local_98,&_kjCondition_3.field_0x1f)
      ;
      local_92 = false;
    }
  }
  local_c8 = 0;
  DStack_c4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c8);
  local_ca = capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field
                       ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_c0,&stack0xffffffffffffff3c,&local_ca);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
  if (!bVar1) {
    local_cb = kj::_::Debug::shouldLog(ERROR);
    while (local_cb != false) {
      local_d0 = 0;
      _kjCondition_4._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c7,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt16Field())\", _kjCondition, 0, reader.getInt16Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt16Field())",
                 (DebugComparison<int,_short> *)local_c0,&local_d0,
                 (short *)&_kjCondition_4.field_0x1e);
      local_cb = false;
    }
  }
  iStack_100 = 0;
  local_fc = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff00);
  local_104 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                        ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_f8,&local_fc,&local_104);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
  if (!bVar1) {
    local_105 = kj::_::Debug::shouldLog(ERROR);
    while (local_105 != false) {
      _kjCondition_5._36_4_ = 0;
      _kjCondition_5._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c8,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt32Field())\", _kjCondition, 0, reader.getInt32Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt32Field())",
                 (DebugComparison<int,_int> *)local_f8,(int *)&_kjCondition_5.field_0x24,
                 (int *)&_kjCondition_5.result);
      local_105 = false;
    }
  }
  local_140 = 0;
  local_13c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_140);
  iStack_148 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                         ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_138,&local_13c,&stack0xfffffffffffffeb8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
  if (!bVar1) {
    local_149 = kj::_::Debug::shouldLog(ERROR);
    while (local_149 != false) {
      local_150 = 0;
      _kjCondition_6._24_8_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c9,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt64Field())\", _kjCondition, 0, reader.getInt64Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt64Field())",
                 (DebugComparison<int,_long> *)local_138,&local_150,(long *)&_kjCondition_6.result);
      local_149 = false;
    }
  }
  local_180 = 0;
  DStack_17c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_180);
  local_181 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field
                        ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_178,&stack0xfffffffffffffe84,
             &local_181);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_178);
  if (!bVar1) {
    local_182 = kj::_::Debug::shouldLog(ERROR);
    while (local_182 != false) {
      local_188 = 0;
      _kjCondition_7._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[50],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ca,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt8Field())\", _kjCondition, 0u, reader.getUInt8Field()"
                 ,(char (*) [50])"failed: expected (0u) == (reader.getUInt8Field())",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_178,&local_188,
                 &_kjCondition_7.field_0x1f);
      local_182 = false;
    }
  }
  local_1b8 = 0;
  DStack_1b4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1b8);
  local_1ba = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field
                        ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_1b0,&stack0xfffffffffffffe4c,
             &local_1ba);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b0);
  if (!bVar1) {
    local_1bb = kj::_::Debug::shouldLog(ERROR);
    while (local_1bb != false) {
      local_1c0 = 0;
      _kjCondition_8._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cb,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt16Field())\", _kjCondition, 0u, reader.getUInt16Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt16Field())",
                 (DebugComparison<unsigned_int,_unsigned_short> *)local_1b0,&local_1c0,
                 (unsigned_short *)&_kjCondition_8.field_0x1e);
      local_1bb = false;
    }
  }
  uStack_1f0 = 0;
  local_1ec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe10);
  local_1f4 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field
                        ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1e8,&local_1ec,&local_1f4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
  if (!bVar1) {
    local_1f5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f5 != false) {
      _kjCondition_9._36_4_ = 0;
      _kjCondition_9._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cc,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt32Field())\", _kjCondition, 0u, reader.getUInt32Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt32Field())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1e8,
                 (uint *)&_kjCondition_9.field_0x24,(uint *)&_kjCondition_9.result);
      local_1f5 = false;
    }
  }
  local_230 = 0;
  local_22c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_230);
  uStack_238 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field
                         ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_228,&local_22c,
             &stack0xfffffffffffffdc8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_228);
  if (!bVar1) {
    local_239 = kj::_::Debug::shouldLog(ERROR);
    while (local_239 != false) {
      local_240 = 0;
      uStack_248 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field
                             ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cd,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt64Field())\", _kjCondition, 0u, reader.getUInt64Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt64Field())",
                 (DebugComparison<unsigned_int,_unsigned_long> *)local_228,&local_240,
                 &stack0xfffffffffffffdb8);
      local_239 = false;
    }
  }
  fVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field
                    ((Builder *)&stack0x00000008);
  local_24a = kj::_::floatAlmostEqual(fVar2,0.0);
  local_249 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_24a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_249);
  if (!bVar1) {
    local_24b = kj::_::Debug::shouldLog(ERROR);
    while (local_24b != false) {
      fStack_250 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field
                             ((Builder *)&stack0x00000008);
      local_254 = 0;
      kj::_::Debug::log<char_const(&)[72],kj::_::DebugExpression<bool>&,float,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ce,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)\", _kjCondition, reader.getFloat32Field(), 0"
                 ,(char (*) [72])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)",
                 &local_249,&stack0xfffffffffffffdb0,&local_254);
      local_24b = false;
    }
  }
  dVar3 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field
                    ((Builder *)&stack0x00000008);
  local_256 = kj::_::doubleAlmostEqual(dVar3,0.0);
  local_255 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_256);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_255);
  if (!bVar1) {
    local_257 = kj::_::Debug::shouldLog(ERROR);
    while (local_257 != false) {
      local_260 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field
                            ((Builder *)&stack0x00000008);
      _kjCondition_12._52_4_ = 0;
      kj::_::Debug::log<char_const(&)[73],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cf,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)\", _kjCondition, reader.getFloat64Field(), 0"
                 ,(char (*) [73])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)",
                 &local_255,&local_260,(int *)&_kjCondition_12.field_0x34);
      local_257 = false;
    }
  }
  local_2a8 = (char (*) [1])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [1])0x4adbe2);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_2c0,(Builder *)&stack0x00000008);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)local_2a0,
             (DebugExpression<char_const(&)[1]> *)&local_2a8,(Builder *)local_2c0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a0);
  if (!bVar1) {
    local_2c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c1 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                ((Builder *)&_kjCondition_13.result,(Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[49],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d0,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (reader.getTextField())\", _kjCondition, \"\", reader.getTextField()"
                 ,(char (*) [49])"failed: expected (\"\") == (reader.getTextField())",
                 (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)local_2a0,
                 (char (*) [1])0x4adbe2,(Builder *)&_kjCondition_13.result);
      local_2c1 = false;
    }
  }
  local_338 = (ArrayPtr<const_unsigned_char>)_::data("");
  local_328 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_338);
  _auStack_348 = (ArrayPtr<unsigned_char>)
                 capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                           ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_318,
             (DebugExpression<capnp::Data::Reader> *)&local_328,(Builder *)auStack_348);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_318);
  if (!bVar1) {
    local_349 = kj::_::Debug::shouldLog(ERROR);
    while (local_349 != false) {
      local_360 = (ArrayPtr<const_unsigned_char>)_::data("");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d1,ERROR,
                 "\"failed: expected \" \"(data(\\\"\\\")) == (reader.getDataField())\", _kjCondition, data(\"\"), reader.getDataField()"
                 ,(char (*) [55])"failed: expected (data(\"\")) == (reader.getDataField())",
                 (DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_318,
                 (Reader *)&local_360,(Builder *)&subReader._builder.dataSize);
      local_349 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)&_kjCondition_14.result,(Builder *)&stack0x00000008);
  DStack_3c8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField
            ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_3c0,
             (DebugExpression<capnp::Void_const&> *)&stack0xfffffffffffffc38,
             (Void *)&_kjCondition_15.field_0x1f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3c0);
  if (!bVar1) {
    _kjCondition_15._29_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_15._29_1_ != '\0') {
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField
                ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d4,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.getVoidField())\", _kjCondition, VOID, subReader.getVoidField()"
                 ,(char (*) [54])"failed: expected (VOID) == (subReader.getVoidField())",
                 (DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_3c0,(Void *)&VOID,
                 (Void *)&_kjCondition_15.field_0x1c);
      _kjCondition_15._29_1_ = 0;
    }
  }
  _kjCondition_16._30_1_ = 0;
  _kjCondition_16._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_16.field_0x1e);
  _kjCondition_16._29_1_ =
       capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField
                 ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_3f0,
             (DebugExpression<bool> *)&_kjCondition_16.field_0x1f,
             (bool *)&_kjCondition_16.field_0x1d);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3f0);
  if (!bVar1) {
    _kjCondition_16._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_16._28_1_ != '\0') {
      _kjCondition_16._27_1_ = 0;
      _kjCondition_16._26_1_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[55],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d5,ERROR,
                 "\"failed: expected \" \"(false) == (subReader.getBoolField())\", _kjCondition, false, subReader.getBoolField()"
                 ,(char (*) [55])"failed: expected (false) == (subReader.getBoolField())",
                 (DebugComparison<bool,_bool> *)local_3f0,(bool *)&_kjCondition_16.field_0x1b,
                 (bool *)&_kjCondition_16.field_0x1a);
      _kjCondition_16._28_1_ = 0;
    }
  }
  local_420 = 0;
  DStack_41c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_420);
  local_421 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_418,&stack0xfffffffffffffbe4,&local_421);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_418);
  if (!bVar1) {
    local_422 = kj::_::Debug::shouldLog(ERROR);
    while (local_422 != false) {
      local_428 = 0;
      _kjCondition_17._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d6,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt8Field())\", _kjCondition, 0, subReader.getInt8Field()"
                 ,(char (*) [51])"failed: expected (0) == (subReader.getInt8Field())",
                 (DebugComparison<int,_signed_char> *)local_418,&local_428,
                 &_kjCondition_17.field_0x1f);
      local_422 = false;
    }
  }
  local_458 = 0;
  DStack_454 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_458);
  local_45a = capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_450,&stack0xfffffffffffffbac,&local_45a);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_450);
  if (!bVar1) {
    local_45b = kj::_::Debug::shouldLog(ERROR);
    while (local_45b != false) {
      local_460 = 0;
      _kjCondition_18._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d7,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt16Field())\", _kjCondition, 0, subReader.getInt16Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt16Field())",
                 (DebugComparison<int,_short> *)local_450,&local_460,
                 (short *)&_kjCondition_18.field_0x1e);
      local_45b = false;
    }
  }
  iStack_490 = 0;
  local_48c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffb70);
  local_494 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_488,&local_48c,&local_494);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_488);
  if (!bVar1) {
    local_495 = kj::_::Debug::shouldLog(ERROR);
    while (local_495 != false) {
      _kjCondition_19._36_4_ = 0;
      _kjCondition_19._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d8,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt32Field())\", _kjCondition, 0, subReader.getInt32Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt32Field())",
                 (DebugComparison<int,_int> *)local_488,(int *)&_kjCondition_19.field_0x24,
                 (int *)&_kjCondition_19.result);
      local_495 = false;
    }
  }
  local_4d0 = 0;
  local_4cc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4d0);
  iStack_4d8 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                         ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_4c8,&local_4cc,&stack0xfffffffffffffb28);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4c8);
  if (!bVar1) {
    local_4d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4d9 != false) {
      local_4e0 = 0;
      _kjCondition_20._24_8_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d9,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt64Field())\", _kjCondition, 0, subReader.getInt64Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt64Field())",
                 (DebugComparison<int,_long> *)local_4c8,&local_4e0,(long *)&_kjCondition_20.result)
      ;
      local_4d9 = false;
    }
  }
  local_510 = 0;
  DStack_50c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_510);
  local_511 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_508,&stack0xfffffffffffffaf4,
             &local_511);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_508);
  if (!bVar1) {
    local_512 = kj::_::Debug::shouldLog(ERROR);
    while (local_512 != false) {
      local_518 = 0;
      _kjCondition_21._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[53],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1da,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt8Field())\", _kjCondition, 0u, subReader.getUInt8Field()"
                 ,(char (*) [53])"failed: expected (0u) == (subReader.getUInt8Field())",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_508,&local_518,
                 &_kjCondition_21.field_0x1f);
      local_512 = false;
    }
  }
  local_548 = 0;
  DStack_544 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_548);
  local_54a = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_540,&stack0xfffffffffffffabc,
             &local_54a);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_540);
  if (!bVar1) {
    local_54b = kj::_::Debug::shouldLog(ERROR);
    while (local_54b != false) {
      local_550 = 0;
      _kjCondition_22._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1db,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt16Field())\", _kjCondition, 0u, subReader.getUInt16Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt16Field())",
                 (DebugComparison<unsigned_int,_unsigned_short> *)local_540,&local_550,
                 (unsigned_short *)&_kjCondition_22.field_0x1e);
      local_54b = false;
    }
  }
  uStack_580 = 0;
  local_57c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffa80);
  local_584 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_578,&local_57c,&local_584);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_578);
  if (!bVar1) {
    local_585 = kj::_::Debug::shouldLog(ERROR);
    while (local_585 != false) {
      _kjCondition_23._36_4_ = 0;
      _kjCondition_23._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1dc,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt32Field())\", _kjCondition, 0u, subReader.getUInt32Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt32Field())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_578,
                 (uint *)&_kjCondition_23.field_0x24,(uint *)&_kjCondition_23.result);
      local_585 = false;
    }
  }
  local_5c0 = 0;
  local_5bc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5c0);
  uStack_5c8 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field
                         ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_5b8,&local_5bc,
             &stack0xfffffffffffffa38);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5b8);
  if (!bVar1) {
    local_5c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5c9 != false) {
      local_5d0 = 0;
      uStack_5d8 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field
                             ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1dd,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt64Field())\", _kjCondition, 0u, subReader.getUInt64Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt64Field())",
                 (DebugComparison<unsigned_int,_unsigned_long> *)local_5b8,&local_5d0,
                 &stack0xfffffffffffffa28);
      local_5c9 = false;
    }
  }
  fVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field
                    ((Builder *)&_kjCondition_14.result);
  local_5da = kj::_::floatAlmostEqual(fVar2,0.0);
  local_5d9 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5da);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_5d9);
  if (!bVar1) {
    local_5db = kj::_::Debug::shouldLog(ERROR);
    while (local_5db != false) {
      fStack_5e0 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field
                             ((Builder *)&_kjCondition_14.result);
      local_5e4 = 0;
      kj::_::Debug::log<char_const(&)[75],kj::_::DebugExpression<bool>&,float,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1de,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)\", _kjCondition, subReader.getFloat32Field(), 0"
                 ,(char (*) [75])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)",
                 &local_5d9,&stack0xfffffffffffffa20,&local_5e4);
      local_5db = false;
    }
  }
  dVar3 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field
                    ((Builder *)&_kjCondition_14.result);
  local_5e6 = kj::_::doubleAlmostEqual(dVar3,0.0);
  local_5e5 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5e6);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_5e5);
  if (!bVar1) {
    local_5e7 = kj::_::Debug::shouldLog(ERROR);
    while (local_5e7 != false) {
      local_5f0 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field
                            ((Builder *)&_kjCondition_14.result);
      _kjCondition_26._52_4_ = 0;
      kj::_::Debug::log<char_const(&)[76],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1df,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)\", _kjCondition, subReader.getFloat64Field(), 0"
                 ,(char (*) [76])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)",
                 &local_5e5,&local_5f0,(int *)&_kjCondition_26.field_0x34);
      local_5e7 = false;
    }
  }
  local_638 = (char (*) [1])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [1])0x4adbe2);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_650,(Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)local_630,
             (DebugExpression<char_const(&)[1]> *)&local_638,(Builder *)local_650);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_630);
  if (!bVar1) {
    local_651 = kj::_::Debug::shouldLog(ERROR);
    while (local_651 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                ((Builder *)&_kjCondition_27.result,(Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e0,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subReader.getTextField())\", _kjCondition, \"\", subReader.getTextField()"
                 ,(char (*) [52])"failed: expected (\"\") == (subReader.getTextField())",
                 (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)local_630,
                 (char (*) [1])0x4adbe2,(Builder *)&_kjCondition_27.result);
      local_651 = false;
    }
  }
  local_6c8 = (ArrayPtr<const_unsigned_char>)_::data("");
  local_6b8 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_6c8);
  _auStack_6d8 = (ArrayPtr<unsigned_char>)
                 capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                           ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_6a8,
             (DebugExpression<capnp::Data::Reader> *)&local_6b8,(Builder *)auStack_6d8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6a8);
  if (!bVar1) {
    local_6d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6d9 != false) {
      local_6f0 = (ArrayPtr<const_unsigned_char>)_::data("");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e1,ERROR,
                 "\"failed: expected \" \"(data(\\\"\\\")) == (subReader.getDataField())\", _kjCondition, data(\"\"), subReader.getDataField()"
                 ,(char (*) [58])"failed: expected (data(\"\")) == (subReader.getDataField())",
                 (DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_6a8,
                 (Reader *)&local_6f0,(Builder *)&subSubReader._builder.dataSize);
      local_6d9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)&_kjCondition_28.result,(Builder *)&_kjCondition_14.result);
  local_768 = (char (*) [1])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [1])0x4adbe2);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_780,(Builder *)&_kjCondition_28.result);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)local_760,
             (DebugExpression<char_const(&)[1]> *)&local_768,(Builder *)local_780);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_760);
  if (!bVar1) {
    local_781 = kj::_::Debug::shouldLog(ERROR);
    while (local_781 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                ((Builder *)&_kjCondition_29.result,(Builder *)&_kjCondition_28.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e4,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getTextField())\", _kjCondition, \"\", subSubReader.getTextField()"
                 ,(char (*) [55])"failed: expected (\"\") == (subSubReader.getTextField())",
                 (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)local_760,
                 (char (*) [1])0x4adbe2,(Builder *)&_kjCondition_29.result);
      local_781 = false;
    }
  }
  local_7e0 = (char (*) [1])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [1])0x4adbe2);
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)local_820,(Builder *)&_kjCondition_28.result);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_7f8,(Builder *)local_820);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)local_7d8,
             (DebugExpression<char_const(&)[1]> *)&local_7e0,&local_7f8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7d8);
  if (!bVar1) {
    local_821 = kj::_::Debug::shouldLog(ERROR);
    while (local_821 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
                ((Builder *)&_kjCondition_30.result,(Builder *)&_kjCondition_28.result);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_840,(Builder *)&_kjCondition_30.result);
      kj::_::Debug::
      log<char_const(&)[72],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e5,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getStructField().getTextField())\", _kjCondition, \"\", subSubReader.getStructField().getTextField()"
                 ,(char (*) [72])
                  "failed: expected (\"\") == (subSubReader.getStructField().getTextField())",
                 (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)local_7d8,
                 (char (*) [1])0x4adbe2,&local_840);
      local_821 = false;
    }
  }
  local_890 = 0;
  local_88c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_890);
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)local_8c0,(Builder *)&_kjCondition_14.result);
  local_894 = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_8c0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_888,&local_88c,&local_894);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_888);
  if (!bVar1) {
    local_8c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8c1 != false) {
      local_8c8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
                ((Builder *)&_kjCondition_31.result,(Builder *)&_kjCondition_14.result);
      local_8cc = List<capnp::Void,_(capnp::Kind)0>::Builder::size
                            ((Builder *)&_kjCondition_31.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e8,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getVoidList().size())\", _kjCondition, 0u, subReader.getVoidList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getVoidList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_888,&local_8c8,&local_8cc);
      local_8c1 = false;
    }
  }
  local_920 = 0;
  local_91c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_920);
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)local_950,(Builder *)&_kjCondition_14.result);
  local_924 = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_950);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_918,&local_91c,&local_924);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_918);
  if (!bVar1) {
    local_951 = kj::_::Debug::shouldLog(ERROR);
    while (local_951 != false) {
      local_958 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
                ((Builder *)&_kjCondition_32.result,(Builder *)&_kjCondition_14.result);
      local_95c = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_32.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e9,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getBoolList().size())\", _kjCondition, 0u, subReader.getBoolList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getBoolList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_918,&local_958,&local_95c);
      local_951 = false;
    }
  }
  local_9b0 = 0;
  local_9ac = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_9b0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)local_9e0,(Builder *)&_kjCondition_14.result);
  local_9b4 = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_9e0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_9a8,&local_9ac,&local_9b4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_9a8);
  if (!bVar1) {
    local_9e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_9e1 != false) {
      local_9e8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
                ((Builder *)&_kjCondition_33.result,(Builder *)&_kjCondition_14.result);
      local_9ec = List<signed_char,_(capnp::Kind)0>::Builder::size
                            ((Builder *)&_kjCondition_33.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ea,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt8List().size())\", _kjCondition, 0u, subReader.getInt8List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getInt8List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_9a8,&local_9e8,&local_9ec);
      local_9e1 = false;
    }
  }
  local_a40 = 0;
  local_a3c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a40);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)local_a70,(Builder *)&_kjCondition_14.result);
  local_a44 = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_a70);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_a38,&local_a3c,&local_a44);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a38);
  if (!bVar1) {
    local_a71 = kj::_::Debug::shouldLog(ERROR);
    while (local_a71 != false) {
      local_a78 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
                ((Builder *)&_kjCondition_34.result,(Builder *)&_kjCondition_14.result);
      local_a7c = List<short,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_34.result);
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1eb,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt16List().size())\", _kjCondition, 0u, subReader.getInt16List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt16List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_a38,&local_a78,&local_a7c);
      local_a71 = false;
    }
  }
  local_ad0 = 0;
  local_acc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_ad0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)local_b00,(Builder *)&_kjCondition_14.result);
  local_ad4 = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_b00);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_ac8,&local_acc,&local_ad4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ac8);
  if (!bVar1) {
    local_b01 = kj::_::Debug::shouldLog(ERROR);
    while (local_b01 != false) {
      local_b08 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
                ((Builder *)&_kjCondition_35.result,(Builder *)&_kjCondition_14.result);
      local_b0c = List<int,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_35.result);
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ec,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt32List().size())\", _kjCondition, 0u, subReader.getInt32List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_ac8,&local_b08,&local_b0c);
      local_b01 = false;
    }
  }
  local_b60 = 0;
  local_b5c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b60);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)local_b90,(Builder *)&_kjCondition_14.result);
  local_b64 = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_b90);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_b58,&local_b5c,&local_b64);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b58);
  if (!bVar1) {
    local_b91 = kj::_::Debug::shouldLog(ERROR);
    while (local_b91 != false) {
      local_b98 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
                ((Builder *)&_kjCondition_36.result,(Builder *)&_kjCondition_14.result);
      local_b9c = List<long,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_36.result);
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ed,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt64List().size())\", _kjCondition, 0u, subReader.getInt64List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_b58,&local_b98,&local_b9c);
      local_b91 = false;
    }
  }
  local_bf0 = 0;
  local_bec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_bf0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)local_c20,(Builder *)&_kjCondition_14.result);
  local_bf4 = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_c20);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_be8,&local_bec,&local_bf4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_be8);
  if (!bVar1) {
    local_c21 = kj::_::Debug::shouldLog(ERROR);
    while (local_c21 != false) {
      local_c28 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
                ((Builder *)&_kjCondition_37.result,(Builder *)&_kjCondition_14.result);
      local_c2c = List<unsigned_char,_(capnp::Kind)0>::Builder::size
                            ((Builder *)&_kjCondition_37.result);
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ee,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt8List().size())\", _kjCondition, 0u, subReader.getUInt8List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getUInt8List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_be8,&local_c28,&local_c2c);
      local_c21 = false;
    }
  }
  local_c80 = 0;
  local_c7c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c80);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)local_cb0,(Builder *)&_kjCondition_14.result);
  local_c84 = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_cb0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_c78,&local_c7c,&local_c84);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c78);
  if (!bVar1) {
    local_cb1 = kj::_::Debug::shouldLog(ERROR);
    while (local_cb1 != false) {
      local_cb8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
                ((Builder *)&_kjCondition_38.result,(Builder *)&_kjCondition_14.result);
      local_cbc = List<unsigned_short,_(capnp::Kind)0>::Builder::size
                            ((Builder *)&_kjCondition_38.result);
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ef,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt16List().size())\", _kjCondition, 0u, subReader.getUInt16List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt16List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_c78,&local_cb8,&local_cbc);
      local_cb1 = false;
    }
  }
  local_d10 = 0;
  local_d0c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d10);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)local_d40,(Builder *)&_kjCondition_14.result);
  local_d14 = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_d40);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_d08,&local_d0c,&local_d14);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d08);
  if (!bVar1) {
    local_d41 = kj::_::Debug::shouldLog(ERROR);
    while (local_d41 != false) {
      local_d48 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
                ((Builder *)&_kjCondition_39.result,(Builder *)&_kjCondition_14.result);
      local_d4c = List<unsigned_int,_(capnp::Kind)0>::Builder::size
                            ((Builder *)&_kjCondition_39.result);
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f0,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt32List().size())\", _kjCondition, 0u, subReader.getUInt32List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_d08,&local_d48,&local_d4c);
      local_d41 = false;
    }
  }
  local_da0 = 0;
  local_d9c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_da0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)local_dd0,(Builder *)&_kjCondition_14.result);
  local_da4 = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_dd0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_d98,&local_d9c,&local_da4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d98);
  if (!bVar1) {
    local_dd1 = kj::_::Debug::shouldLog(ERROR);
    while (local_dd1 != false) {
      local_dd8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
                ((Builder *)&_kjCondition_40.result,(Builder *)&_kjCondition_14.result);
      local_ddc = List<unsigned_long,_(capnp::Kind)0>::Builder::size
                            ((Builder *)&_kjCondition_40.result);
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f1,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt64List().size())\", _kjCondition, 0u, subReader.getUInt64List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_d98,&local_dd8,&local_ddc);
      local_dd1 = false;
    }
  }
  local_e30 = 0;
  local_e2c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_e30);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)local_e60,(Builder *)&_kjCondition_14.result);
  local_e34 = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_e60);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_e28,&local_e2c,&local_e34);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e28);
  if (!bVar1) {
    local_e61 = kj::_::Debug::shouldLog(ERROR);
    while (local_e61 != false) {
      local_e68 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
                ((Builder *)&_kjCondition_41.result,(Builder *)&_kjCondition_14.result);
      local_e6c = List<float,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_41.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f2,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getFloat32List().size())\", _kjCondition, 0u, subReader.getFloat32List().size()"
                 ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_e28,&local_e68,&local_e6c);
      local_e61 = false;
    }
  }
  local_ec0 = 0;
  local_ebc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_ec0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)local_ef0,(Builder *)&_kjCondition_14.result);
  local_ec4 = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_ef0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_eb8,&local_ebc,&local_ec4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_eb8);
  if (!bVar1) {
    local_ef1 = kj::_::Debug::shouldLog(ERROR);
    while (local_ef1 != false) {
      local_ef8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
                ((Builder *)&_kjCondition_42.result,(Builder *)&_kjCondition_14.result);
      local_efc = List<double,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_42.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,499,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getFloat64List().size())\", _kjCondition, 0u, subReader.getFloat64List().size()"
                 ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_eb8,&local_ef8,&local_efc);
      local_ef1 = false;
    }
  }
  local_f50 = 0;
  local_f4c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f50);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)local_f80,(Builder *)&_kjCondition_14.result);
  local_f54 = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_f80);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_f48,&local_f4c,&local_f54);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f48);
  if (!bVar1) {
    local_f81 = kj::_::Debug::shouldLog(ERROR);
    while (local_f81 != false) {
      local_f88 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
                ((Builder *)&_kjCondition_43.result,(Builder *)&_kjCondition_14.result);
      local_f8c = List<capnp::Text,_(capnp::Kind)1>::Builder::size
                            ((Builder *)&_kjCondition_43.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,500,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getTextList().size())\", _kjCondition, 0u, subReader.getTextList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getTextList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_f48,&local_f88,&local_f8c);
      local_f81 = false;
    }
  }
  local_fe0 = 0;
  local_fdc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_fe0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)local_1010,(Builder *)&_kjCondition_14.result);
  local_fe4 = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_1010);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_fd8,&local_fdc,&local_fe4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_fd8);
  if (!bVar1) {
    local_1011 = kj::_::Debug::shouldLog(ERROR);
    while (local_1011 != false) {
      local_1018 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
                ((Builder *)&_kjCondition_44.result,(Builder *)&_kjCondition_14.result);
      local_101c = List<capnp::Data,_(capnp::Kind)1>::Builder::size
                             ((Builder *)&_kjCondition_44.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f5,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getDataList().size())\", _kjCondition, 0u, subReader.getDataList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getDataList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_fd8,&local_1018,&local_101c);
      local_1011 = false;
    }
  }
  local_1070 = 0;
  local_106c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1070);
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)local_10a0,(Builder *)&_kjCondition_14.result);
  local_1074 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                         ((Builder *)local_10a0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1068,&local_106c,&local_1074);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1068);
  if (!bVar1) {
    local_10a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_10a1 != false) {
      local_10a8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
                ((Builder *)&_kjCondition_45.result,(Builder *)&_kjCondition_14.result);
      local_10ac = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                             ((Builder *)&_kjCondition_45.result);
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f6,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getStructList().size())\", _kjCondition, 0u, subReader.getStructList().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getStructList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1068,&local_10a8,&local_10ac);
      local_10a1 = false;
    }
  }
  local_1100 = 0;
  local_10fc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1100);
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)local_1130,(Builder *)&stack0x00000008);
  local_1104 = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_1130);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_10f8,&local_10fc,&local_1104);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_10f8);
  if (!bVar1) {
    local_1131 = kj::_::Debug::shouldLog(ERROR);
    while (local_1131 != false) {
      local_1138 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
                ((Builder *)&_kjCondition_46.result,(Builder *)&stack0x00000008);
      local_113c = List<capnp::Void,_(capnp::Kind)0>::Builder::size
                             ((Builder *)&_kjCondition_46.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f9,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getVoidList().size())\", _kjCondition, 0u, reader.getVoidList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getVoidList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_10f8,&local_1138,&local_113c);
      local_1131 = false;
    }
  }
  local_1190 = 0;
  local_118c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1190);
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)local_11c0,(Builder *)&stack0x00000008);
  local_1194 = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)local_11c0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1188,&local_118c,&local_1194);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1188);
  if (!bVar1) {
    local_11c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_11c1 != false) {
      local_11c8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
                ((Builder *)&_kjCondition_47.result,(Builder *)&stack0x00000008);
      local_11cc = List<bool,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_47.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fa,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getBoolList().size())\", _kjCondition, 0u, reader.getBoolList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getBoolList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1188,&local_11c8,&local_11cc);
      local_11c1 = false;
    }
  }
  local_1220 = 0;
  local_121c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1220);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)local_1250,(Builder *)&stack0x00000008);
  local_1224 = List<signed_char,_(capnp::Kind)0>::Builder::size((Builder *)local_1250);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1218,&local_121c,&local_1224);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1218);
  if (!bVar1) {
    local_1251 = kj::_::Debug::shouldLog(ERROR);
    while (local_1251 != false) {
      local_1258 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
                ((Builder *)&_kjCondition_48.result,(Builder *)&stack0x00000008);
      local_125c = List<signed_char,_(capnp::Kind)0>::Builder::size
                             ((Builder *)&_kjCondition_48.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fb,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt8List().size())\", _kjCondition, 0u, reader.getInt8List().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getInt8List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1218,&local_1258,&local_125c);
      local_1251 = false;
    }
  }
  local_12b0 = 0;
  local_12ac = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_12b0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)local_12e0,(Builder *)&stack0x00000008);
  local_12b4 = List<short,_(capnp::Kind)0>::Builder::size((Builder *)local_12e0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_12a8,&local_12ac,&local_12b4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_12a8);
  if (!bVar1) {
    local_12e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_12e1 != false) {
      local_12e8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
                ((Builder *)&_kjCondition_49.result,(Builder *)&stack0x00000008);
      local_12ec = List<short,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_49.result);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fc,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt16List().size())\", _kjCondition, 0u, reader.getInt16List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt16List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_12a8,&local_12e8,&local_12ec);
      local_12e1 = false;
    }
  }
  local_1340 = 0;
  local_133c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1340);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)local_1370,(Builder *)&stack0x00000008);
  local_1344 = List<int,_(capnp::Kind)0>::Builder::size((Builder *)local_1370);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1338,&local_133c,&local_1344);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1338);
  if (!bVar1) {
    local_1371 = kj::_::Debug::shouldLog(ERROR);
    while (local_1371 != false) {
      local_1378 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
                ((Builder *)&_kjCondition_50.result,(Builder *)&stack0x00000008);
      local_137c = List<int,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_50.result);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fd,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt32List().size())\", _kjCondition, 0u, reader.getInt32List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1338,&local_1378,&local_137c);
      local_1371 = false;
    }
  }
  local_13d0 = 0;
  local_13cc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_13d0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)local_1400,(Builder *)&stack0x00000008);
  local_13d4 = List<long,_(capnp::Kind)0>::Builder::size((Builder *)local_1400);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_13c8,&local_13cc,&local_13d4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_13c8);
  if (!bVar1) {
    local_1401 = kj::_::Debug::shouldLog(ERROR);
    while (local_1401 != false) {
      local_1408 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
                ((Builder *)&_kjCondition_51.result,(Builder *)&stack0x00000008);
      local_140c = List<long,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_51.result);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fe,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt64List().size())\", _kjCondition, 0u, reader.getInt64List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_13c8,&local_1408,&local_140c);
      local_1401 = false;
    }
  }
  local_1460 = 0;
  local_145c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1460);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)local_1490,(Builder *)&stack0x00000008);
  local_1464 = List<unsigned_char,_(capnp::Kind)0>::Builder::size((Builder *)local_1490);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1458,&local_145c,&local_1464);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1458);
  if (!bVar1) {
    local_1491 = kj::_::Debug::shouldLog(ERROR);
    while (local_1491 != false) {
      local_1498 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
                ((Builder *)&_kjCondition_52.result,(Builder *)&stack0x00000008);
      local_149c = List<unsigned_char,_(capnp::Kind)0>::Builder::size
                             ((Builder *)&_kjCondition_52.result);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ff,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt8List().size())\", _kjCondition, 0u, reader.getUInt8List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getUInt8List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1458,&local_1498,&local_149c);
      local_1491 = false;
    }
  }
  local_14f0 = 0;
  local_14ec = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_14f0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)local_1520,(Builder *)&stack0x00000008);
  local_14f4 = List<unsigned_short,_(capnp::Kind)0>::Builder::size((Builder *)local_1520);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_14e8,&local_14ec,&local_14f4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14e8);
  if (!bVar1) {
    local_1521 = kj::_::Debug::shouldLog(ERROR);
    while (local_1521 != false) {
      local_1528 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
                ((Builder *)&_kjCondition_53.result,(Builder *)&stack0x00000008);
      local_152c = List<unsigned_short,_(capnp::Kind)0>::Builder::size
                             ((Builder *)&_kjCondition_53.result);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x200,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt16List().size())\", _kjCondition, 0u, reader.getUInt16List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt16List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_14e8,&local_1528,&local_152c);
      local_1521 = false;
    }
  }
  local_1580 = 0;
  local_157c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1580);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)local_15b0,(Builder *)&stack0x00000008);
  local_1584 = List<unsigned_int,_(capnp::Kind)0>::Builder::size((Builder *)local_15b0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1578,&local_157c,&local_1584);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1578);
  if (!bVar1) {
    local_15b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_15b1 != false) {
      local_15b8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
                ((Builder *)&_kjCondition_54.result,(Builder *)&stack0x00000008);
      local_15bc = List<unsigned_int,_(capnp::Kind)0>::Builder::size
                             ((Builder *)&_kjCondition_54.result);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x201,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt32List().size())\", _kjCondition, 0u, reader.getUInt32List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1578,&local_15b8,&local_15bc);
      local_15b1 = false;
    }
  }
  local_1610 = 0;
  local_160c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1610);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)local_1640,(Builder *)&stack0x00000008);
  local_1614 = List<unsigned_long,_(capnp::Kind)0>::Builder::size((Builder *)local_1640);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1608,&local_160c,&local_1614);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1608);
  if (!bVar1) {
    local_1641 = kj::_::Debug::shouldLog(ERROR);
    while (local_1641 != false) {
      local_1648 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
                ((Builder *)&_kjCondition_55.result,(Builder *)&stack0x00000008);
      local_164c = List<unsigned_long,_(capnp::Kind)0>::Builder::size
                             ((Builder *)&_kjCondition_55.result);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x202,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt64List().size())\", _kjCondition, 0u, reader.getUInt64List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1608,&local_1648,&local_164c);
      local_1641 = false;
    }
  }
  local_16a0 = 0;
  local_169c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_16a0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)local_16d0,(Builder *)&stack0x00000008);
  local_16a4 = List<float,_(capnp::Kind)0>::Builder::size((Builder *)local_16d0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1698,&local_169c,&local_16a4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1698);
  if (!bVar1) {
    local_16d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_16d1 != false) {
      local_16d8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
                ((Builder *)&_kjCondition_56.result,(Builder *)&stack0x00000008);
      local_16dc = List<float,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_56.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x203,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getFloat32List().size())\", _kjCondition, 0u, reader.getFloat32List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (reader.getFloat32List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1698,&local_16d8,&local_16dc);
      local_16d1 = false;
    }
  }
  local_1730 = 0;
  local_172c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1730);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)local_1760,(Builder *)&stack0x00000008);
  local_1734 = List<double,_(capnp::Kind)0>::Builder::size((Builder *)local_1760);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1728,&local_172c,&local_1734);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1728);
  if (!bVar1) {
    local_1761 = kj::_::Debug::shouldLog(ERROR);
    while (local_1761 != false) {
      local_1768 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
                ((Builder *)&_kjCondition_57.result,(Builder *)&stack0x00000008);
      local_176c = List<double,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_57.result);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x204,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getFloat64List().size())\", _kjCondition, 0u, reader.getFloat64List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (reader.getFloat64List().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1728,&local_1768,&local_176c);
      local_1761 = false;
    }
  }
  local_17c0 = 0;
  local_17bc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_17c0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)local_17f0,(Builder *)&stack0x00000008);
  local_17c4 = List<capnp::Text,_(capnp::Kind)1>::Builder::size((Builder *)local_17f0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_17b8,&local_17bc,&local_17c4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_17b8);
  if (!bVar1) {
    local_17f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_17f1 != false) {
      local_17f8 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
                ((Builder *)&_kjCondition_58.result,(Builder *)&stack0x00000008);
      local_17fc = List<capnp::Text,_(capnp::Kind)1>::Builder::size
                             ((Builder *)&_kjCondition_58.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x205,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getTextList().size())\", _kjCondition, 0u, reader.getTextList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getTextList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_17b8,&local_17f8,&local_17fc);
      local_17f1 = false;
    }
  }
  local_1850 = 0;
  local_184c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1850);
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)local_1880,(Builder *)&stack0x00000008);
  local_1854 = List<capnp::Data,_(capnp::Kind)1>::Builder::size((Builder *)local_1880);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1848,&local_184c,&local_1854);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1848);
  if (!bVar1) {
    local_1881 = kj::_::Debug::shouldLog(ERROR);
    while (local_1881 != false) {
      local_1888 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
                ((Builder *)&_kjCondition_59.result,(Builder *)&stack0x00000008);
      local_188c = List<capnp::Data,_(capnp::Kind)1>::Builder::size
                             ((Builder *)&_kjCondition_59.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x206,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataList().size())\", _kjCondition, 0u, reader.getDataList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getDataList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1848,&local_1888,&local_188c);
      local_1881 = false;
    }
  }
  local_18e0 = 0;
  local_18dc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_18e0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)local_1910,(Builder *)&stack0x00000008);
  local_18e4 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                         ((Builder *)local_1910);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_18d8,&local_18dc,&local_18e4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_18d8);
  if (!bVar1) {
    local_1911 = kj::_::Debug::shouldLog(ERROR);
    while (local_1911 != false) {
      local_1918 = 0;
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
                (&local_1948,(Builder *)&stack0x00000008);
      local_191c = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                             (&local_1948);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x207,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getStructList().size())\", _kjCondition, 0u, reader.getStructList().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getStructList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_18d8,&local_1918,&local_191c);
      local_1911 = false;
    }
  }
  return;
}

Assistant:

void genericCheckTestMessageAllZero(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(false, reader.getBoolField());
  EXPECT_EQ(0, reader.getInt8Field());
  EXPECT_EQ(0, reader.getInt16Field());
  EXPECT_EQ(0, reader.getInt32Field());
  EXPECT_EQ(0, reader.getInt64Field());
  EXPECT_EQ(0u, reader.getUInt8Field());
  EXPECT_EQ(0u, reader.getUInt16Field());
  EXPECT_EQ(0u, reader.getUInt32Field());
  EXPECT_EQ(0u, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(0, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(0, reader.getFloat64Field());
  EXPECT_EQ("", reader.getTextField());
  EXPECT_EQ(data(""), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(false, subReader.getBoolField());
    EXPECT_EQ(0, subReader.getInt8Field());
    EXPECT_EQ(0, subReader.getInt16Field());
    EXPECT_EQ(0, subReader.getInt32Field());
    EXPECT_EQ(0, subReader.getInt64Field());
    EXPECT_EQ(0u, subReader.getUInt8Field());
    EXPECT_EQ(0u, subReader.getUInt16Field());
    EXPECT_EQ(0u, subReader.getUInt32Field());
    EXPECT_EQ(0u, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(0, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(0, subReader.getFloat64Field());
    EXPECT_EQ("", subReader.getTextField());
    EXPECT_EQ(data(""), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("", subSubReader.getTextField());
      EXPECT_EQ("", subSubReader.getStructField().getTextField());
    }

    EXPECT_EQ(0u, subReader.getVoidList().size());
    EXPECT_EQ(0u, subReader.getBoolList().size());
    EXPECT_EQ(0u, subReader.getInt8List().size());
    EXPECT_EQ(0u, subReader.getInt16List().size());
    EXPECT_EQ(0u, subReader.getInt32List().size());
    EXPECT_EQ(0u, subReader.getInt64List().size());
    EXPECT_EQ(0u, subReader.getUInt8List().size());
    EXPECT_EQ(0u, subReader.getUInt16List().size());
    EXPECT_EQ(0u, subReader.getUInt32List().size());
    EXPECT_EQ(0u, subReader.getUInt64List().size());
    EXPECT_EQ(0u, subReader.getFloat32List().size());
    EXPECT_EQ(0u, subReader.getFloat64List().size());
    EXPECT_EQ(0u, subReader.getTextList().size());
    EXPECT_EQ(0u, subReader.getDataList().size());
    EXPECT_EQ(0u, subReader.getStructList().size());
  }

  EXPECT_EQ(0u, reader.getVoidList().size());
  EXPECT_EQ(0u, reader.getBoolList().size());
  EXPECT_EQ(0u, reader.getInt8List().size());
  EXPECT_EQ(0u, reader.getInt16List().size());
  EXPECT_EQ(0u, reader.getInt32List().size());
  EXPECT_EQ(0u, reader.getInt64List().size());
  EXPECT_EQ(0u, reader.getUInt8List().size());
  EXPECT_EQ(0u, reader.getUInt16List().size());
  EXPECT_EQ(0u, reader.getUInt32List().size());
  EXPECT_EQ(0u, reader.getUInt64List().size());
  EXPECT_EQ(0u, reader.getFloat32List().size());
  EXPECT_EQ(0u, reader.getFloat64List().size());
  EXPECT_EQ(0u, reader.getTextList().size());
  EXPECT_EQ(0u, reader.getDataList().size());
  EXPECT_EQ(0u, reader.getStructList().size());
}